

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QMap<QString,_QVariant> * __thiscall
QMap<QString,_QMap<QString,_QVariant>_>::operator[]
          (QMap<QString,_QMap<QString,_QVariant>_> *this,QString *key)

{
  bool bVar1;
  QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>
  *pQVar2;
  pointer ppVar3;
  value_type *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>,_bool> pVar4;
  iterator i;
  QMap<QString,_QMap<QString,_QVariant>_> copy;
  map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
  *in_stack_ffffffffffffff58;
  QMap<QString,_QVariant> *pQVar5;
  QMap<QString,_QMap<QString,_QVariant>_> *in_stack_ffffffffffffff60;
  map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
  *this_00;
  pair<const_QString,_QMap<QString,_QVariant>_> *this_01;
  map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
  local_58;
  _Self local_28;
  undefined8 local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff60->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff60,
         (QMap<QString,_QMap<QString,_QVariant>_> *)in_stack_ffffffffffffff58);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<QString,_QMap<QString,_QVariant>_> *)0x1388bf);
  }
  detach(in_stack_ffffffffffffff60);
  local_28._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
                *)0x1388e2);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x1388f3);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
                *)0x138905);
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
               ::end(in_stack_ffffffffffffff58);
  bVar1 = std::operator==(&local_28,
                          (_Self *)&local_58._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    pQVar2 = QtPrivate::
             QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
             ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
                           *)0x13893b);
    this_01 = (pair<const_QString,_QMap<QString,_QVariant>_> *)&pQVar2->m;
    local_58._M_t._M_impl._0_8_ = 0;
    this_00 = &local_58;
    QMap<QString,_QVariant>::QMap((QMap<QString,_QVariant> *)0x138966);
    std::pair<const_QString,_QMap<QString,_QVariant>_>::pair<QMap<QString,_QVariant>,_true>
              (this_01,(QString *)this_00,(QMap<QString,_QVariant> *)in_RSI);
    pVar4 = std::
            map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>
            ::insert(this_00,in_RSI);
    local_28._M_node = (_Base_ptr)pVar4.first._M_node;
    local_10 = pVar4.second;
    local_18 = local_28._M_node;
    std::pair<const_QString,_QMap<QString,_QVariant>_>::~pair(in_RSI);
    QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x1389d3);
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_QString,_QMap<QString,_QVariant>_>_> *)
                      0x1389e0);
  pQVar5 = &ppVar3->second;
  ~QMap((QMap<QString,_QMap<QString,_QVariant>_> *)0x1389f5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }